

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.h
# Opt level: O2

CornerIndex __thiscall draco::CornerTable::SwingLeft(CornerTable *this,CornerIndex corner)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0xffffffff;
  if (corner.value_ != 0xffffffff) {
    uVar2 = corner.value_ - 2;
    if ((corner.value_ + 1) % 3 != 0) {
      uVar2 = corner.value_ + 1;
    }
    if ((uVar2 != 0xffffffff) &&
       (uVar2 = (this->opposite_corners_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar2].value_, uVar2 != 0xffffffff)) {
      uVar1 = uVar2 - 2;
      if ((uVar2 + 1) % 3 != 0) {
        uVar1 = uVar2 + 1;
      }
    }
  }
  return (CornerIndex)uVar1;
}

Assistant:

inline CornerIndex SwingLeft(CornerIndex corner) const {
    return Next(Opposite(Next(corner)));
  }